

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

void mi_free_block_mt(mi_page_t *page,mi_segment_t *segment,mi_block_t *block)

{
  _Bool _Var1;
  long lVar2;
  mi_heap_t *pmVar3;
  mi_page_t *in_RDX;
  mi_segment_t *in_RSI;
  mi_page_t *in_RDI;
  mi_segment_t *unaff_retaddr;
  mi_heap_t *in_stack_00000008;
  mi_block_t *in_stack_00000088;
  mi_page_t *in_stack_00000090;
  mi_block_t *in_stack_ffffffffffffffe0;
  
  lVar2 = _mi_option_get_fast(mi_option_abandoned_reclaim_on_free);
  if (((lVar2 != 0) &&
      (in_stack_ffffffffffffffe0 = (mi_block_t *)in_RSI->thread_id,
      in_stack_ffffffffffffffe0 == (mi_block_t *)0x0)) &&
     (pmVar3 = mi_prim_get_default_heap(), pmVar3 != &_mi_heap_empty)) {
    mi_heap_get_default();
    _Var1 = _mi_segment_attempt_reclaim(in_stack_00000008,unaff_retaddr);
    if (_Var1) {
      mi_free(unaff_retaddr);
      return;
    }
  }
  mi_check_padding(in_RDI,(mi_block_t *)in_RDX);
  mi_stat_free(in_RDI,(mi_block_t *)in_RDX);
  _mi_padding_shrink(in_RDI,(mi_block_t *)in_RDX,8);
  if (in_RSI->kind == MI_SEGMENT_HUGE) {
    _mi_segment_huge_page_reset(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  mi_free_block_delayed_mt(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

static void mi_decl_noinline mi_free_block_mt(mi_page_t* page, mi_segment_t* segment, mi_block_t* block)
{
  // first see if the segment was abandoned and if we can reclaim it into our thread
  if (_mi_option_get_fast(mi_option_abandoned_reclaim_on_free) != 0 &&
      #if MI_HUGE_PAGE_ABANDON
      segment->page_kind != MI_PAGE_HUGE &&
      #endif
      mi_atomic_load_relaxed(&segment->thread_id) == 0 &&  // segment is abandoned?
      mi_prim_get_default_heap() != (mi_heap_t*)&_mi_heap_empty) // and we did not already exit this thread (without this check, a fresh heap will be initalized (issue #944))
  {
    // the segment is abandoned, try to reclaim it into our heap
    if (_mi_segment_attempt_reclaim(mi_heap_get_default(), segment)) {
      mi_assert_internal(_mi_thread_id() == mi_atomic_load_relaxed(&segment->thread_id));
      mi_assert_internal(mi_heap_get_default()->tld->segments.subproc == segment->subproc);
      mi_free(block);  // recursively free as now it will be a local free in our heap
      return;
    }
  }

  // The padding check may access the non-thread-owned page for the key values.
  // that is safe as these are constant and the page won't be freed (as the block is not freed yet).
  mi_check_padding(page, block);

  // adjust stats (after padding check and potentially recursive `mi_free` above)
  mi_stat_free(page, block);    // stat_free may access the padding
  mi_track_free_size(block, mi_page_usable_size_of(page,block));

  // for small size, ensure we can fit the delayed thread pointers without triggering overflow detection
  _mi_padding_shrink(page, block, sizeof(mi_block_t));

  if (segment->kind == MI_SEGMENT_HUGE) {
    #if MI_HUGE_PAGE_ABANDON
    // huge page segments are always abandoned and can be freed immediately
    _mi_segment_huge_page_free(segment, page, block);
    return;
    #else
    // huge pages are special as they occupy the entire segment
    // as these are large we reset the memory occupied by the page so it is available to other threads
    // (as the owning thread needs to actually free the memory later).
    _mi_segment_huge_page_reset(segment, page, block);
    #endif
  }
  else {
    #if (MI_DEBUG>0) && !MI_TRACK_ENABLED  && !MI_TSAN       // note: when tracking, cannot use mi_usable_size with multi-threading
    memset(block, MI_DEBUG_FREED, mi_usable_size(block));
    #endif
  }

  // and finally free the actual block by pushing it on the owning heap
  // thread_delayed free list (or heap delayed free list)
  mi_free_block_delayed_mt(page,block);
}